

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmdblookup.c
# Opt level: O0

void dump_meta(MMDB_s *mmdb)

{
  tm *__tp;
  ulong local_60;
  size_t i_1;
  size_t i;
  time_t epoch;
  char date [40];
  char *meta_dump;
  MMDB_s *mmdb_local;
  
  date._32_8_ = anon_var_dwarf_32d;
  i = (mmdb->metadata).build_epoch;
  __tp = gmtime((time_t *)&i);
  strftime((char *)&epoch,0x28,"%F %T UTC",__tp);
  fprintf(_stdout,(char *)date._32_8_,(ulong)(mmdb->metadata).node_count,
          (ulong)(mmdb->metadata).record_size,(ulong)(mmdb->metadata).ip_version,
          (ulong)(mmdb->metadata).binary_format_major_version,
          (uint)(mmdb->metadata).binary_format_minor_version,(mmdb->metadata).build_epoch,&epoch,
          (mmdb->metadata).database_type);
  for (i_1 = 0; i_1 < (mmdb->metadata).languages.count; i_1 = i_1 + 1) {
    fprintf(_stdout,"%s",(mmdb->metadata).languages.names[i_1]);
    if (i_1 < (mmdb->metadata).languages.count - 1) {
      fprintf(_stdout," ");
    }
  }
  fprintf(_stdout,"\n");
  fprintf(_stdout,"    Description:\n");
  for (local_60 = 0; local_60 < (mmdb->metadata).description.count; local_60 = local_60 + 1) {
    fprintf(_stdout,"      %s:   %s\n",(mmdb->metadata).description.descriptions[local_60]->language
            ,(mmdb->metadata).description.descriptions[local_60]->description);
  }
  fprintf(_stdout,"\n");
  return;
}

Assistant:

static void dump_meta(MMDB_s *mmdb) {
    const char *meta_dump = "\n"
                            "  Database metadata\n"
                            "    Node count:    %i\n"
                            "    Record size:   %i bits\n"
                            "    IP version:    IPv%i\n"
                            "    Binary format: %i.%i\n"
                            "    Build epoch:   %llu (%s)\n"
                            "    Type:          %s\n"
                            "    Languages:     ";

    char date[40];
    const time_t epoch = (const time_t)mmdb->metadata.build_epoch;
    strftime(date, 40, "%F %T UTC", gmtime(&epoch));

    fprintf(stdout,
            meta_dump,
            mmdb->metadata.node_count,
            mmdb->metadata.record_size,
            mmdb->metadata.ip_version,
            mmdb->metadata.binary_format_major_version,
            mmdb->metadata.binary_format_minor_version,
            mmdb->metadata.build_epoch,
            date,
            mmdb->metadata.database_type);

    for (size_t i = 0; i < mmdb->metadata.languages.count; i++) {
        fprintf(stdout, "%s", mmdb->metadata.languages.names[i]);
        if (i < mmdb->metadata.languages.count - 1) {
            fprintf(stdout, " ");
        }
    }
    fprintf(stdout, "\n");

    fprintf(stdout, "    Description:\n");
    for (size_t i = 0; i < mmdb->metadata.description.count; i++) {
        fprintf(stdout,
                "      %s:   %s\n",
                mmdb->metadata.description.descriptions[i]->language,
                mmdb->metadata.description.descriptions[i]->description);
    }
    fprintf(stdout, "\n");
}